

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppMul8(word *c,word *a,word *b,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  ulong *in_RDI;
  word *t;
  word *b_00;
  
  b_00 = in_RCX;
  ppMul4(in_RSI,in_RDX,in_RCX,in_RCX);
  ppMul4(in_RSI,in_RDX,b_00,in_RCX);
  *in_RCX = *in_RSI ^ in_RSI[4];
  in_RCX[1] = in_RSI[1] ^ in_RSI[5];
  in_RCX[2] = in_RSI[2] ^ in_RSI[6];
  in_RCX[3] = in_RSI[3] ^ in_RSI[7];
  in_RCX[4] = *in_RDX ^ in_RDX[4];
  in_RCX[5] = in_RDX[1] ^ in_RDX[5];
  in_RCX[6] = in_RDX[2] ^ in_RDX[6];
  in_RCX[7] = in_RDX[3] ^ in_RDX[7];
  in_RCX[8] = in_RDI[4] ^ in_RDI[8];
  in_RCX[9] = in_RDI[5] ^ in_RDI[9];
  in_RCX[10] = in_RDI[6] ^ in_RDI[10];
  in_RCX[0xb] = in_RDI[7] ^ in_RDI[0xb];
  ppMul4(in_RSI,in_RDX,b_00,in_RCX);
  in_RDI[4] = *in_RDI ^ in_RCX[8] ^ in_RDI[4];
  in_RDI[5] = in_RDI[1] ^ in_RCX[9] ^ in_RDI[5];
  in_RDI[6] = in_RDI[2] ^ in_RCX[10] ^ in_RDI[6];
  in_RDI[7] = in_RDI[3] ^ in_RCX[0xb] ^ in_RDI[7];
  in_RDI[8] = in_RDI[0xc] ^ in_RCX[8] ^ in_RDI[8];
  in_RDI[9] = in_RDI[0xd] ^ in_RCX[9] ^ in_RDI[9];
  in_RDI[10] = in_RDI[0xe] ^ in_RCX[10] ^ in_RDI[10];
  in_RDI[0xb] = in_RDI[0xf] ^ in_RCX[0xb] ^ in_RDI[0xb];
  return;
}

Assistant:

static void ppMul8(word c[16], const word a[8], const word b[8], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 8, c, 16));
	ASSERT(wwIsDisjoint2(b, 8, c, 16));
	// c1 || c0 <- a0 b0
	ppMul4(c, a, b, t);
	// c3 || c2 <- a1 b1
	ppMul4(c + 8, a + 4, b + 4, t);
	// t0 <- a0 + a1
	t[0] = a[0] ^ a[4];
	t[1] = a[1] ^ a[5];
	t[2] = a[2] ^ a[6];
	t[3] = a[3] ^ a[7];
	// t1 <- b0 + b1
	t[4] = b[0] ^ b[4];
	t[5] = b[1] ^ b[5];
	t[6] = b[2] ^ b[6];
	t[7] = b[3] ^ b[7];
	// t2 <- c1 + c2
	t[8] = c[4] ^ c[8];
	t[9] = c[5] ^ c[9];
	t[10] = c[6] ^ c[10];
	t[11] = c[7] ^ c[11];
	// c2 || c1 <- w0 w1
	ppMul4(c + 4, t, t + 4, t + 12);
	// c1 <- c1 + c0 + w2
	c[4] ^= c[0] ^ t[8];
	c[5] ^= c[1] ^ t[9];
	c[6] ^= c[2] ^ t[10];
	c[7] ^= c[3] ^ t[11];
	// c2 <- c2 + c3 + w2
	c[8] ^= c[12] ^ t[8];
	c[9] ^= c[13] ^ t[9];
	c[10] ^= c[14] ^ t[10];
	c[11] ^= c[15] ^ t[11];
}